

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O1

MovePack * movePack_dup(MovePack *movePack)

{
  unsigned_long uVar1;
  MovePack *pMVar2;
  Move **ppMVar3;
  Move *pMVar4;
  ulong uVar5;
  
  pMVar2 = (MovePack *)malloc(0x10);
  pMVar2->movesCount = 0;
  pMVar2->moves = (Move **)0x0;
  uVar1 = movePack->movesCount;
  ppMVar3 = (Move **)malloc(uVar1 * 8);
  pMVar2->moves = ppMVar3;
  pMVar2->movesCount = uVar1;
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      pMVar4 = move_dup(movePack->moves[uVar5]);
      ppMVar3[uVar5] = pMVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 < movePack->movesCount);
  }
  return pMVar2;
}

Assistant:

MovePack * movePack_dup(MovePack * movePack)
{
	unsigned long i;
	MovePack * dupMovePack = movePack_create();
	dupMovePack->moves = (Move **)malloc(sizeof(Move *)*movePack->movesCount);
	dupMovePack->movesCount = movePack->movesCount;
	for(i=0;i<movePack->movesCount;i++)
	{
		dupMovePack->moves[i] = move_dup(movePack->moves[i]);
	}

	return dupMovePack;
}